

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::ShaderAtomicCompSwapCase::ShaderAtomicCompSwapCase
          (ShaderAtomicCompSwapCase *this,Context *context,char *name,AtomicOperandType operandType,
          DataType type,Precision precision)

{
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,"atomicCompSwap() Test");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderAtomicCompSwapCase_0219e568;
  this->m_operandType = operandType;
  this->m_type = type;
  this->m_precision = precision;
  (this->m_workGroupSize).m_data[0] = 3;
  (this->m_workGroupSize).m_data[1] = 2;
  *(undefined8 *)((this->m_workGroupSize).m_data + 2) = 0x400000001;
  (this->m_numWorkGroups).m_data[1] = 4;
  (this->m_numWorkGroups).m_data[2] = 4;
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

ShaderAtomicCompSwapCase::ShaderAtomicCompSwapCase (Context& context, const char* name, AtomicOperandType operandType, DataType type, Precision precision)
	: TestCase			(context, name, "atomicCompSwap() Test")
	, m_operandType		(operandType)
	, m_type			(type)
	, m_precision		(precision)
	, m_workGroupSize	(3,2,1)
	, m_numWorkGroups	(4,4,4)
	, m_program			(DE_NULL)
{
}